

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_utils.c
# Opt level: O0

library_t * add_library(link_map *map)

{
  library_t *data;
  library_t *newlib;
  link_map *map_local;
  
  data = (library_t *)malloc(0x20);
  data->map = map;
  data->flags = 0;
  data->generation = 0;
  data->next = library_list;
  data->prev = (library_t *)0x0;
  if (library_list != (library_t *)0x0) {
    library_list->prev = data;
  }
  library_list = data;
  addto_hashtable(&library_table,map,data);
  return data;
}

Assistant:

struct library_t *add_library(struct link_map *map) {
  library_t *newlib = gotcha_malloc(sizeof(library_t));
  newlib->map = map;
  newlib->flags = 0;
  newlib->generation = 0;
  newlib->next = library_list;
  newlib->prev = NULL;
  if (library_list) library_list->prev = newlib;
  library_list = newlib;
  addto_hashtable(&library_table, (hash_key_t)map, (hash_data_t)newlib);
  return newlib;
}